

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O2

pnode_t * append_word(s3wid_t w,pnode_t *prev_end,s3cipid_t *pred_ci,s3cipid_t *succ_ci)

{
  short sVar1;
  s3cipid_t *psVar2;
  short *psVar3;
  pnode_t *ppVar4;
  pnode_t *ppVar5;
  pnode_t *dst;
  int iVar6;
  ulong uVar7;
  pnode_s *ppVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar10 = -1;
  psVar3 = pred_ci;
  do {
    iVar10 = iVar10 + 1;
    sVar1 = *psVar3;
    psVar3 = psVar3 + 1;
  } while (-1 < sVar1);
  iVar6 = -1;
  psVar3 = succ_ci;
  do {
    iVar6 = iVar6 + 1;
    sVar1 = *psVar3;
    psVar3 = psVar3 + 1;
  } while (-1 < sVar1);
  lVar9 = (long)dict->word[(uint)w].pronlen;
  if (lVar9 == 1) {
    ppVar5 = (pnode_t *)0x0;
    for (uVar7 = 0; uVar7 != iVar10 + (uint)(iVar10 == 0); uVar7 = uVar7 + 1) {
      for (uVar11 = 0; uVar11 != iVar6 + (uint)(iVar6 == 0); uVar11 = uVar11 + 1) {
        ppVar4 = alloc_pnode(w,0,*dict->word[(uint)w].ciphone,pred_ci[uVar7],succ_ci[uVar11],
                             WORD_POSN_SINGLE);
        for (ppVar8 = prev_end; ppVar8 != (pnode_t *)0x0; ppVar8 = ppVar8->next) {
          if ((ppVar8->ci == ppVar4->lc) && ((ppVar8->rc < 0 || (ppVar8->rc == ppVar4->ci)))) {
            link_pnodes(ppVar8,ppVar4);
          }
        }
        ppVar4->next = ppVar5;
        ppVar5 = ppVar4;
      }
    }
  }
  else {
    ppVar4 = (pnode_t *)0x0;
    for (uVar7 = 0; uVar7 != iVar10 + (uint)(iVar10 == 0); uVar7 = uVar7 + 1) {
      psVar2 = dict->word[(uint)w].ciphone;
      ppVar5 = alloc_pnode(w,0,*psVar2,pred_ci[uVar7],psVar2[1],WORD_POSN_BEGIN);
      for (ppVar8 = prev_end; ppVar8 != (pnode_t *)0x0; ppVar8 = ppVar8->next) {
        if ((ppVar8->ci == ppVar5->lc) && ((ppVar8->rc < 0 || (ppVar8->rc == ppVar5->ci)))) {
          link_pnodes(ppVar8,ppVar5);
        }
      }
      ppVar5->next = ppVar4;
      ppVar4 = ppVar5;
    }
    uVar7 = 1;
    while ((long)uVar7 < lVar9 + -1) {
      psVar2 = dict->word[(uint)w].ciphone;
      uVar11 = uVar7 + 1;
      ppVar5 = alloc_pnode(w,(int32)uVar7,psVar2[uVar7],psVar2[uVar7 - 1],psVar2[uVar7 + 1],
                           WORD_POSN_INTERNAL);
      for (ppVar8 = ppVar4; ppVar4 = ppVar5, uVar7 = uVar11, ppVar8 != (pnode_t *)0x0;
          ppVar8 = ppVar8->next) {
        link_pnodes(ppVar8,ppVar5);
      }
    }
    ppVar5 = (pnode_t *)0x0;
    for (uVar11 = 0; uVar11 != iVar6 + (uint)(iVar6 == 0); uVar11 = uVar11 + 1) {
      psVar2 = dict->word[(uint)w].ciphone;
      dst = alloc_pnode(w,(int32)uVar7,psVar2[uVar7 & 0xffffffff],psVar2[(uVar7 & 0xffffffff) - 1],
                        succ_ci[uVar11],WORD_POSN_END);
      for (ppVar8 = ppVar4; ppVar8 != (pnode_t *)0x0; ppVar8 = ppVar8->next) {
        link_pnodes(ppVar8,dst);
      }
      dst->next = ppVar5;
      ppVar5 = dst;
    }
  }
  return ppVar5;
}

Assistant:

static pnode_t *
append_word(s3wid_t w,
            pnode_t * prev_end, s3cipid_t * pred_ci, s3cipid_t * succ_ci)
{
    int32 i, M, N, m, n, pronlen, pron;
    pnode_t *node, *nodelist, *p;

    for (i = 0; IS_S3CIPID(pred_ci[i]); i++);
    M = (i > 0) ? i : 1;        /* #predecessor CI phones */

    for (i = 0; IS_S3CIPID(succ_ci[i]); i++);
    N = (i > 0) ? i : 1;        /* #successor CI phones */

    if ((pronlen = dict->word[w].pronlen) == 1) {
        /* Single phone case; replicated MxN times for all possible contexts */
        nodelist = NULL;

        for (m = 0; m < M; m++) {
            for (n = 0; n < N; n++) {
                node = alloc_pnode(w, 0,
                                   dict->word[w].ciphone[0], pred_ci[m],
                                   succ_ci[n], WORD_POSN_SINGLE);
                /* Link to all predecessor nodes matching context requirements */
                for (p = prev_end; p; p = p->next) {
                    if ((p->ci == node->lc) &&
                        ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                        link_pnodes(p, node);
                    }
                }

                node->next = nodelist;
                nodelist = node;
            }
        }

        return nodelist;
    }

    /* Multi-phone case.  First phone, replicated M times */
    nodelist = NULL;
    for (m = 0; m < M; m++) {
        node = alloc_pnode(w, 0,
                           dict->word[w].ciphone[0],
                           pred_ci[m],
                           dict->word[w].ciphone[1], WORD_POSN_BEGIN);
        /* Link to predecessor node(s) matching context requirements */
        for (p = prev_end; p; p = p->next) {
            if ((p->ci == node->lc) &&
                ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                link_pnodes(p, node);
            }
        }
        node->next = nodelist;
        nodelist = node;
    }

    /* Intermediate phones */
    for (pron = 1; pron < pronlen - 1; pron++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           dict->word[w].ciphone[pron + 1],
                           WORD_POSN_INTERNAL);
        for (p = nodelist; p; p = p->next)
            link_pnodes(p, node);
        nodelist = node;
    }

    /* Final phone, replicated N times */
    prev_end = nodelist;
    nodelist = NULL;
    for (n = 0; n < N; n++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           succ_ci[n], WORD_POSN_END);
        for (p = prev_end; p; p = p->next)
            link_pnodes(p, node);
        node->next = nodelist;
        nodelist = node;
    }

    return nodelist;
}